

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O3

lzham_decompress_state_ptr lzham::lzham_lib_decompress_init(lzham_decompress_params *pParams)

{
  void *pvVar1;
  lzham_uint32 lVar2;
  lzham_uint32 lVar3;
  lzham_uint32 lVar4;
  lzham_uint32 lVar5;
  undefined4 uVar6;
  bool bVar7;
  EVP_PKEY_CTX *context;
  lzham_decompressor *this;
  uint8 *puVar8;
  EVP_PKEY_CTX *ctx;
  long lVar9;
  
  bVar7 = check_params(pParams);
  if (bVar7) {
    context = (EVP_PKEY_CTX *)lzham_create_malloc_context(0x9800);
    this = (lzham_decompressor *)lzham_malloc(context,0x720,(size_t *)0x0);
    if (this != (lzham_decompressor *)0x0) {
      ctx = context;
      lzham_decompressor::lzham_decompressor(this,context);
      lVar2 = pParams->m_dict_size_log2;
      lVar3 = pParams->m_table_update_rate;
      lVar4 = pParams->m_decompress_flags;
      lVar5 = pParams->m_num_seed_bytes;
      uVar6 = *(undefined4 *)&pParams->field_0x14;
      pvVar1 = pParams->m_pSeed_bytes;
      (this->m_params).m_struct_size = pParams->m_struct_size;
      (this->m_params).m_dict_size_log2 = lVar2;
      (this->m_params).m_table_update_rate = lVar3;
      (this->m_params).m_decompress_flags = lVar4;
      lVar2 = pParams->m_table_update_interval_slow_rate;
      (this->m_params).m_table_max_update_interval = pParams->m_table_max_update_interval;
      (this->m_params).m_table_update_interval_slow_rate = lVar2;
      (this->m_params).m_num_seed_bytes = lVar5;
      *(undefined4 *)&(this->m_params).field_0x14 = uVar6;
      (this->m_params).m_pSeed_bytes = pvVar1;
      if (((this->m_params).m_decompress_flags & 1) != 0) {
        this->m_raw_decomp_buf_size = 0;
        this->m_pRaw_decomp_buf = (uint8 *)0x0;
        this->m_pDecomp_buf = (uint8 *)0x0;
LAB_00105278:
        lzham_decompressor::init(this,ctx);
        return this;
      }
      lVar9 = 1L << ((byte)(this->m_params).m_dict_size_log2 & 0x3f);
      ctx = (EVP_PKEY_CTX *)(lVar9 + 0xf);
      puVar8 = (uint8 *)lzham_malloc(context,(size_t)ctx,(size_t *)0x0);
      this->m_pRaw_decomp_buf = puVar8;
      if (puVar8 != (uint8 *)0x0) {
        this->m_raw_decomp_buf_size = (uint32)lVar9;
        this->m_pDecomp_buf = (uint8 *)((ulong)(puVar8 + 0xf) & 0xfffffffffffffff0);
        goto LAB_00105278;
      }
      lzham_decompressor::~lzham_decompressor(this);
      lzham_free(context,this);
    }
    lzham_destroy_malloc_context(context);
  }
  return (lzham_decompress_state_ptr)0x0;
}

Assistant:

lzham_decompress_state_ptr LZHAM_CDECL lzham_lib_decompress_init(const lzham_decompress_params *pParams)
   {
      LZHAM_ASSUME(CLZDecompBase::cMinDictSizeLog2 == LZHAM_MIN_DICT_SIZE_LOG2);
      LZHAM_ASSUME(CLZDecompBase::cMaxDictSizeLog2 == LZHAM_MAX_DICT_SIZE_LOG2_X64);

      if (!check_params(pParams))
         return NULL;

      lzham_malloc_context malloc_context = lzham_create_malloc_context(LZHAM_DECOMP_MEMORY_ARENA_SIZE);
      
      lzham_decompressor *pState = lzham_new<lzham_decompressor>(malloc_context, malloc_context);
      if (!pState)
      {
         lzham_destroy_malloc_context(malloc_context);
         return NULL;
      }
      
      pState->m_params = *pParams;

      if (pState->m_params.m_decompress_flags & LZHAM_DECOMP_FLAG_OUTPUT_UNBUFFERED)
      {
         pState->m_pRaw_decomp_buf = NULL;
         pState->m_raw_decomp_buf_size = 0;
         pState->m_pDecomp_buf = NULL;
      }
      else
      {
         uint32 decomp_buf_size = 1U << pState->m_params.m_dict_size_log2;
         pState->m_pRaw_decomp_buf = static_cast<uint8*>(lzham_malloc(malloc_context, decomp_buf_size + 15));
         if (!pState->m_pRaw_decomp_buf)
         {
            lzham_delete(malloc_context, pState);
            lzham_destroy_malloc_context(malloc_context);
            return NULL;
         }
         pState->m_raw_decomp_buf_size = decomp_buf_size;
         pState->m_pDecomp_buf = math::align_up_pointer(pState->m_pRaw_decomp_buf, 16);
      }

      pState->init();
      
      return pState;
   }